

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::FocusableItemRegister(ImGuiWindow *window,ImGuiID id,bool tab_stop)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  int local_34;
  bool allow_keyboard_focus;
  ImGuiContext *g;
  bool tab_stop_local;
  ImGuiID id_local;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  bVar3 = ((window->DC).ItemFlags & 5U) == 1;
  window->FocusIdxAllCounter = window->FocusIdxAllCounter + 1;
  if (bVar3) {
    window->FocusIdxTabCounter = window->FocusIdxTabCounter + 1;
  }
  if (((((tab_stop) && (pIVar1->ActiveId == id)) && (window->FocusIdxAllRequestNext == 0x7fffffff))
      && ((window->FocusIdxTabRequestNext == 0x7fffffff && (((pIVar1->IO).KeyCtrl & 1U) == 0)))) &&
     (bVar2 = IsKeyPressedMap(0,true), bVar2)) {
    if (((pIVar1->IO).KeyShift & 1U) == 0) {
      local_34 = 1;
    }
    else {
      local_34 = 0;
      if (bVar3) {
        local_34 = -1;
      }
    }
    window->FocusIdxTabRequestNext = window->FocusIdxTabCounter + local_34;
  }
  if (window->FocusIdxAllCounter == window->FocusIdxAllRequestCurrent) {
    window_local._7_1_ = true;
  }
  else if ((bVar3) && (window->FocusIdxTabCounter == window->FocusIdxTabRequestCurrent)) {
    pIVar1->NavJustTabbedId = id;
    window_local._7_1_ = true;
  }
  else {
    window_local._7_1_ = false;
  }
  return window_local._7_1_;
}

Assistant:

bool ImGui::FocusableItemRegister(ImGuiWindow* window, ImGuiID id, bool tab_stop)
{
    ImGuiContext& g = *GImGui;

    const bool allow_keyboard_focus = (window->DC.ItemFlags & (ImGuiItemFlags_AllowKeyboardFocus | ImGuiItemFlags_Disabled)) == ImGuiItemFlags_AllowKeyboardFocus;
    window->FocusIdxAllCounter++;
    if (allow_keyboard_focus)
        window->FocusIdxTabCounter++;

    // Process keyboard input at this point: TAB/Shift-TAB to tab out of the currently focused item.
    // Note that we can always TAB out of a widget that doesn't allow tabbing in.
    if (tab_stop && (g.ActiveId == id) && window->FocusIdxAllRequestNext == INT_MAX && window->FocusIdxTabRequestNext == INT_MAX && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab))
        window->FocusIdxTabRequestNext = window->FocusIdxTabCounter + (g.IO.KeyShift ? (allow_keyboard_focus ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.

    if (window->FocusIdxAllCounter == window->FocusIdxAllRequestCurrent)
        return true;
    if (allow_keyboard_focus && window->FocusIdxTabCounter == window->FocusIdxTabRequestCurrent)
    {
        g.NavJustTabbedId = id;
        return true;
    }

    return false;
}